

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

ostream * operator<<(ostream *os,S2LatLngRect *r)

{
  ostream *poVar1;
  S2LatLng local_30;
  S2LatLng local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[Lo",3);
  local_20.coords_.c_[0] = (r->lat_).bounds_.c_[0];
  local_20.coords_.c_[1] = (r->lng_).bounds_.c_[0];
  poVar1 = operator<<(os,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Hi",4);
  local_30.coords_.c_[0] = (r->lat_).bounds_.c_[1];
  local_30.coords_.c_[1] = (r->lng_).bounds_.c_[1];
  poVar1 = operator<<(poVar1,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const S2LatLngRect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}